

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O0

void bfs(int u,vector<int,_std::allocator<int>_> *distance,vector<int,_std::allocator<int>_> *path)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference this;
  reference piVar6;
  reference rVar7;
  reference local_d8;
  reference local_c8;
  int local_b4;
  iterator iStack_b0;
  int to;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  undefined1 auStack_90 [4];
  int u_1;
  _Bit_type local_88;
  undefined1 local_70 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  vector<int,_std::allocator<int>_> *path_local;
  vector<int,_std::allocator<int>_> *distance_local;
  int u_local;
  
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node
       = (_Map_pointer)path;
  distance_local._4_4_ = u;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_70);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_70,
             (value_type *)((long)&distance_local + 4));
  _auStack_90 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedbfs,
                           (long)distance_local._4_4_);
  std::_Bit_reference::operator=((_Bit_reference *)auStack_90,true);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node,(long)distance_local._4_4_);
  *pvVar4 = -1;
  while( true ) {
    bVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_70);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    pvVar5 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_70);
    iVar1 = *pvVar5;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_70);
    this = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&edge,(long)iVar1);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this);
    iStack_b0 = std::vector<int,_std::allocator<int>_>::end(this);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff50);
      if (!bVar3) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_b4 = *piVar6;
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedbfs,
                         (long)local_b4);
      local_c8 = rVar7;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedbfs,
                           (long)local_b4);
        local_d8 = rVar7;
        std::_Bit_reference::operator=(&local_d8,true);
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_70,&local_b4);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](distance,(long)iVar1);
        iVar2 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](distance,(long)local_b4);
        *pvVar4 = iVar2 + 1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node,(long)local_b4);
        *pvVar4 = iVar1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_70);
  return;
}

Assistant:

void bfs(int u, vector<int> &distance, vector<int> &path) {
    queue<int> q;
    q.push(u);
    usedbfs[u] = true;
    path[u] = -1;
    while (!q.empty()) {
        int u = q.front();
        q.pop();
        for (int to : edge[u]) {
            if (!usedbfs[to]) {
                usedbfs[to] = true;
                q.push(to);
                distance[to] = distance[u] + 1;
                path[to] = u;
            }
        }
    }
}